

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O3

bool wallet::GetWalletNameFromJSONRPCRequest(JSONRPCRequest *request,string *wallet_name)

{
  ulong uVar1;
  pointer __s1;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  size_type __rlen;
  size_t sVar5;
  long in_FS_OFFSET;
  string_view url_encoded;
  string local_48;
  long local_28;
  
  uVar2 = _DAT_00b38ad8;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = (request->URI)._M_string_length;
  sVar5 = uVar1 - _DAT_00b38ad8;
  if ((uVar1 < _DAT_00b38ad8) ||
     ((__s1 = (request->URI)._M_dataplus._M_p, _DAT_00b38ad8 != 0 &&
      (iVar4 = bcmp(__s1,WALLET_ENDPOINT_BASE_abi_cxx11_,_DAT_00b38ad8), iVar4 != 0)))) {
    bVar3 = false;
  }
  else {
    url_encoded._M_str = __s1 + uVar2;
    url_encoded._M_len = sVar5;
    UrlDecode_abi_cxx11_(&local_48,url_encoded);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (wallet_name,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    bVar3 = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return bVar3;
}

Assistant:

bool GetWalletNameFromJSONRPCRequest(const JSONRPCRequest& request, std::string& wallet_name)
{
    if (request.URI.starts_with(WALLET_ENDPOINT_BASE)) {
        // wallet endpoint was used
        wallet_name = UrlDecode(std::string_view{request.URI}.substr(WALLET_ENDPOINT_BASE.size()));
        return true;
    }
    return false;
}